

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd-pickup.c
# Opt level: O3

void player_pickup_gold(player *p)

{
  uint32_t *puVar1;
  short sVar2;
  loc grid;
  object *poVar3;
  loc grid_00;
  loc grid_01;
  bool bVar4;
  _Bool _Var5;
  int iVar6;
  object *obj;
  object_kind *poVar7;
  bool bVar8;
  char *pcVar9;
  uint type;
  char name [30];
  char buf [100];
  int local_c0;
  char local_b8 [32];
  char local_98 [104];
  
  local_b8[0x10] = '\0';
  local_b8[0x11] = '\0';
  local_b8[0x12] = '\0';
  local_b8[0x13] = '\0';
  local_b8[0x14] = '\0';
  local_b8[0x15] = '\0';
  local_b8[0x16] = '\0';
  local_b8[0x17] = '\0';
  local_b8[0x18] = '\0';
  local_b8[0x19] = '\0';
  local_b8[0x1a] = '\0';
  local_b8[0x1b] = '\0';
  local_b8[0x1c] = '\0';
  local_b8[0x1d] = '\0';
  local_b8[0] = '\0';
  local_b8[1] = '\0';
  local_b8[2] = '\0';
  local_b8[3] = '\0';
  local_b8[4] = '\0';
  local_b8[5] = '\0';
  local_b8[6] = '\0';
  local_b8[7] = '\0';
  local_b8[8] = '\0';
  local_b8[9] = '\0';
  local_b8[10] = '\0';
  local_b8[0xb] = '\0';
  local_b8[0xc] = '\0';
  local_b8[0xd] = '\0';
  local_b8[0xe] = '\0';
  local_b8[0xf] = '\0';
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  obj = square_object(cave,grid);
  if (obj != (object *)0x0) {
    bVar8 = false;
    bVar4 = true;
    local_c0 = 0;
    do {
      poVar3 = obj->next;
      poVar7 = lookup_kind((uint)obj->tval,(uint)obj->sval);
      _Var5 = tval_is_money(obj);
      if (poVar7 != (object_kind *)0x0 && _Var5) {
        pcVar9 = poVar7->name;
        if (local_c0 == 0) {
LAB_0013337e:
          my_strcpy(local_b8,pcVar9,0x1e);
        }
        else {
          iVar6 = strcmp(pcVar9,local_b8);
          if (iVar6 == 0) goto LAB_0013337e;
          bVar4 = false;
        }
        _Var5 = ignore_item_ok(p,obj);
        sVar2 = obj->pval;
        if (obj->known != (object *)0x0) {
          grid_00.x = (p->grid).x;
          grid_00.y = (p->grid).y;
          square_delete_object((chunk_conflict *)p->cave,grid_00,obj->known,false,false);
        }
        bVar8 = (bool)(bVar8 | !_Var5);
        local_c0 = local_c0 + sVar2;
        grid_01.x = (p->grid).x;
        grid_01.y = (p->grid).y;
        square_delete_object(cave,grid_01,obj,false,false);
      }
      obj = poVar3;
    } while (poVar3 != (object *)0x0);
    if (local_c0 != 0) {
      strnfmt(local_98,100,"You have found %ld gold pieces worth of ",(long)local_c0);
      pcVar9 = "treasures";
      if (bVar4) {
        pcVar9 = local_b8;
      }
      my_strcat(local_98,pcVar9,100);
      my_strcat(local_98,".",100);
      if (bVar8) {
        type = 0x52;
        if (199 < local_c0) {
          type = (599 < local_c0) + 0x53;
        }
        msgt(type,"%s",local_98);
      }
      p->au = p->au + local_c0;
      puVar1 = &p->upkeep->redraw;
      *puVar1 = *puVar1 | 0x100;
    }
  }
  return;
}

Assistant:

static void player_pickup_gold(struct player *p)
{
	int32_t total_gold = 0L;
	char name[30] = "";

	struct object *obj = square_object(cave, p->grid), *next;

	int sound_msg;
	bool verbal = false;
	bool at_most_one = true;

	/* Pick up all the ordinary gold objects */
	while (obj) {
		struct object_kind *kind = NULL;

		/* Get next object */
		next = obj->next;

		/* Ignore if not legal treasure */
		kind = lookup_kind(obj->tval, obj->sval);
		if (!tval_is_money(obj) || !kind) {
			obj = next;
			continue;
		}

		/* Multiple types if we have a second name, otherwise record the name */
		if (total_gold && !streq(kind->name, name))
			at_most_one = false;
		else
			my_strcpy(name, kind->name, sizeof(name));

		/* Remember whether feedback message is in order */
		if (!ignore_item_ok(p, obj))
			verbal = true;

		/* Increment total value */
		total_gold += (int32_t)obj->pval;

		/* Delete the gold */
		if (obj->known) {
			square_delete_object(p->cave, p->grid, obj->known, false, false);
		}
		square_delete_object(cave, p->grid, obj, false, false);
		obj = next;
	}

	/* Pick up the gold, if present */
	if (total_gold) {
		char buf[100];

		/* Build a message */
		(void)strnfmt(buf, sizeof(buf),
			"You have found %ld gold pieces worth of ", (long)total_gold);

		/* One treasure type.. */
		if (at_most_one)
			my_strcat(buf, name, sizeof(buf));
		/* ... or more */
		else
			my_strcat(buf, "treasures", sizeof(buf));
		my_strcat(buf, ".", sizeof(buf));

		/* Determine which sound to play */
		if      (total_gold < 200) sound_msg = MSG_MONEY1;
		else if (total_gold < 600) sound_msg = MSG_MONEY2;
		else                       sound_msg = MSG_MONEY3;

		/* Display the message */
		if (verbal)
			msgt(sound_msg, "%s", buf);

		/* Add gold to purse */
		p->au += total_gold;

		/* Redraw gold */
		p->upkeep->redraw |= (PR_GOLD);
	}
}